

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

void __thiscall
ot::commissioner::CommissionerImpl::Connect
          (CommissionerImpl *this,ErrorHandler *aHandler,string *aAddr,uint16_t aPort)

{
  __0 *this_00;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  anon_class_40_2_3adf01b8 onConnected;
  
  std::function<void_(ot::commissioner::Error)>::function(&onConnected.aHandler,aHandler);
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  onConnected.this = this;
  this_00 = (__0 *)operator_new(0x28);
  Connect(std::function<void(ot::commissioner::Error)>,std::__cxx11::string_const&,unsigned_short)::
  $_0::__0(this_00,&onConnected);
  pcStack_50 = std::
               _Function_handler<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:318:24)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:318:24)>
             ::_M_manager;
  local_68._M_unused._0_8_ = (undefined8)this_00;
  coap::CoapSecure::Connect(&this->mBrClient,(ConnectHandler *)&local_68,aAddr,aPort);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&onConnected);
  return;
}

Assistant:

void CommissionerImpl::Connect(ErrorHandler aHandler, const std::string &aAddr, uint16_t aPort)
{
    auto onConnected = [&, aHandler](const DtlsSession &, Error aError) {
        if (aError == ErrorCode::kNone)
        {
            this->mState = State::kConnected;
        }
        aHandler(aError);
    };
    mBrClient.Connect(onConnected, aAddr, aPort);
}